

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintDouble
          (FastFieldValuePrinter *this,double val,BaseTextGenerator *generator)

{
  uint uVar1;
  io *this_00;
  bool bVar2;
  allocator<char> local_51;
  string local_50;
  string_view local_30;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  double val_local;
  FastFieldValuePrinter *this_local;
  
  this_00 = (io *)generator;
  local_20 = generator;
  generator_local = (BaseTextGenerator *)val;
  val_local = (double)this;
  uVar1 = std::isnan(val);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"nan",&local_51);
  }
  else {
    io::SimpleDtoa_abi_cxx11_(&local_50,this_00,(double)generator_local);
  }
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  BaseTextGenerator::PrintString(generator,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    std::allocator<char>::~allocator(&local_51);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintDouble(
    double val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? io::SimpleDtoa(val) : "nan");
}